

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hh
# Opt level: O2

fixed_depth_iterator * __thiscall
tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::begin_fixed
          (fixed_depth_iterator *__return_storage_ptr__,
          tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_> *this,
          iterator_base *pos,uint dp)

{
  uint uVar1;
  range_error *this_00;
  tree_node_<libDAI::BoundTreeNode> *ptVar2;
  tree_node_<libDAI::BoundTreeNode> *ptVar3;
  
  uVar1 = 0;
  ptVar2 = pos->node;
  do {
    if (dp <= uVar1) {
      (__return_storage_ptr__->super_iterator_base).node = ptVar2;
      (__return_storage_ptr__->super_iterator_base).skip_current_children_ = false;
      return __return_storage_ptr__;
    }
    while (ptVar3 = ptVar2, ptVar2->first_child == (tree_node_<libDAI::BoundTreeNode> *)0x0) {
      while (ptVar2 = ptVar3->next_sibling, ptVar2 == (tree_node_<libDAI::BoundTreeNode> *)0x0) {
        ptVar3 = ptVar3->parent;
        if (ptVar3 == (tree_node_<libDAI::BoundTreeNode> *)0x0) {
          this_00 = (range_error *)__cxa_allocate_exception(0x10);
          std::range_error::range_error(this_00,"tree: begin_fixed out of range");
          __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
        }
        uVar1 = uVar1 - 1;
      }
    }
    uVar1 = uVar1 + 1;
    ptVar2 = ptVar2->first_child;
  } while( true );
}

Assistant:

typename tree<T, tree_node_allocator>::fixed_depth_iterator tree<T, tree_node_allocator>::begin_fixed(const iterator_base& pos, unsigned int dp) const
   {
   tree_node *tmp=pos.node;
   unsigned int curdepth=0;
   while(curdepth<dp) { // go down one level
      while(tmp->first_child==0) {
         if(tmp->next_sibling==0) {
            // try to walk up and then right again
            do {
               tmp=tmp->parent;
               if(tmp==0) 
                  throw std::range_error("tree: begin_fixed out of range");
               --curdepth;
               } while(tmp->next_sibling==0);
            }
         tmp=tmp->next_sibling;
         }
      tmp=tmp->first_child;
      ++curdepth;
      }
   return tmp;
   }